

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::findOrCreateLightSource(SemanticParser *this,SP *in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
  *this_01;
  SP SVar3;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  if (((__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)
      &(in_RDX._M_pi)->_vptr__Sp_counted_base)->_M_ptr == (element_type *)0x0) {
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
               *)(in + 5);
    p_Var2 = in_RDX._M_pi;
    pmVar1 = std::
             map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
             ::operator[](this_01,(key_type *)in_RDX._M_pi);
    if ((pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) {
      this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RDX._M_pi)->_M_use_count)->_M_pi
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      createLightSourceFrom((SemanticParser *)&stack0xffffffffffffffd8,(SP *)p_Var2);
      pmVar1 = std::
               map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
               ::operator[](this_01,(key_type *)in_RDX._M_pi);
      p_Var2 = (pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_28;
      (pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = _Stack_20._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    pmVar1 = std::
             map<std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>,_std::less<std::shared_ptr<pbrt::syntactic::LightSource>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::LightSource>,_std::shared_ptr<pbrt::LightSource>_>_>_>
             ::operator[](this_01,(key_type *)in_RDX._M_pi);
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (pmVar1->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    in_RDX._M_pi = extraout_RDX;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SP)SVar3.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

LightSource::SP SemanticParser::findOrCreateLightSource(pbrt::syntactic::LightSource::SP in)
  {
    if (!in)
      return LightSource::SP();

    if (!lightSourceMapping[in]) {
      lightSourceMapping[in] = createLightSourceFrom(in);
    }
    return lightSourceMapping[in];
  }